

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O2

Vec_Str_t * Io_WriteEncodeLiterals(Vec_Int_t *vLits)

{
  int iVar1;
  uint x;
  int iVar2;
  uint uVar3;
  Vec_Str_t *pVVar4;
  uchar *pBuffer;
  int iVar5;
  size_t __size;
  
  iVar5 = vLits->nSize;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar5 * 2 - 1U) {
    iVar2 = iVar5 * 2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar2;
  if (iVar2 == 0) {
    pBuffer = (uchar *)0x0;
  }
  else {
    pBuffer = (uchar *)malloc((long)iVar2);
  }
  pVVar4->pArray = (char *)pBuffer;
  x = Vec_IntEntry(vLits,0);
  iVar2 = Io_WriteAigerEncode(pBuffer,0,x);
  for (iVar5 = 1; iVar5 < vLits->nSize; iVar5 = iVar5 + 1) {
    uVar3 = Vec_IntEntry(vLits,iVar5);
    iVar1 = uVar3 - x;
    if ((int)uVar3 < (int)x) {
      iVar1 = -(uVar3 - x);
    }
    iVar2 = Io_WriteAigerEncode(pBuffer,iVar2,(uint)((int)uVar3 < (int)x) + iVar1 * 2);
    if (pVVar4->nCap < iVar2 + 10) {
      __size = (long)pVVar4->nCap + 1;
      if (pBuffer == (uchar *)0x0) {
        pBuffer = (uchar *)malloc(__size);
      }
      else {
        pBuffer = (uchar *)realloc(pBuffer,__size);
      }
      pVVar4->pArray = (char *)pBuffer;
      pVVar4->nCap = (int)__size;
    }
    x = uVar3;
  }
  pVVar4->nSize = iVar2;
  return pVVar4;
}

Assistant:

Vec_Str_t * Io_WriteEncodeLiterals( Vec_Int_t * vLits )
{
    Vec_Str_t * vBinary;
    int Pos = 0, Lit, LitPrev, Diff, i;
    vBinary = Vec_StrAlloc( 2 * Vec_IntSize(vLits) );
    LitPrev = Vec_IntEntry( vLits, 0 );
    Pos = Io_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, LitPrev ); 
    Vec_IntForEachEntryStart( vLits, Lit, i, 1 )
    {
        Diff = Lit - LitPrev;
        Diff = (Lit < LitPrev)? -Diff : Diff;
        Diff = (Diff << 1) | (int)(Lit < LitPrev);
        Pos = Io_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, Diff );
        LitPrev = Lit;
        if ( Pos + 10 > vBinary->nCap )
            Vec_StrGrow( vBinary, vBinary->nCap+1 );
    }
    vBinary->nSize = Pos;
/*
    // verify
    {
        extern Vec_Int_t * Io_WriteDecodeLiterals( char ** ppPos, int nEntries );
        char * pPos = Vec_StrArray( vBinary );
        Vec_Int_t * vTemp = Io_WriteDecodeLiterals( &pPos, Vec_IntSize(vLits) );
        for ( i = 0; i < Vec_IntSize(vLits); i++ )
        {
            int Entry1 = Vec_IntEntry(vLits,i);
            int Entry2 = Vec_IntEntry(vTemp,i);
            assert( Entry1 == Entry2 );
        }
    }
*/
    return vBinary;
}